

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_device_main_loop__alsa(ma_device *pDevice)

{
  ma_uint32 mVar1;
  ma_context *pmVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  ma_result mVar7;
  ma_device_type mVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  ma_uint64 capturedClientFramesToProcessThisIteration;
  ma_uint32 capturedDeviceFramesToProcess;
  ma_uint64 capturedDeviceFramesToProcessThisIteration;
  ma_uint8 playbackClientData [4096];
  ma_uint8 playbackDeviceData [4096];
  ma_uint8 capturedDeviceData [4096];
  ma_uint8 capturedClientData [4096];
  int local_4084;
  ulong local_4078;
  int local_4070;
  uint local_406c;
  ulong local_4068;
  ulong local_4060;
  uint local_4054;
  ma_data_converter *local_4050;
  ulong local_4048;
  ma_data_converter *local_4040;
  undefined1 local_4038 [4096];
  ma_uint32 local_3038 [1024];
  undefined1 local_2038 [4096];
  undefined1 local_1038 [4104];
  
  if (pDevice == (ma_device *)0x0) {
    __assert_fail("pDevice != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x45ab,"ma_result ma_device_main_loop__alsa(ma_device *)");
  }
  if (((pDevice->type & ~ma_device_type_playback) == ma_device_type_capture) &&
     (iVar5 = (*(pDevice->pContext->field_21).alsa.snd_pcm_start)
                        ((pDevice->field_23).alsa.pPCMCapture), iVar5 < 0)) {
    mVar7 = ma_result_from_errno(-iVar5);
    pmVar2 = pDevice->pContext;
    if ((pmVar2 != (ma_context *)0x0) && (pmVar2->logCallback != (ma_log_proc)0x0)) {
      (*pmVar2->logCallback)
                (pmVar2,pDevice,1,"[ALSA] Failed to start device in preparation for reading.");
    }
  }
  else {
    mVar7 = 0;
    if (pDevice->state == 2) {
      local_4040 = &(pDevice->capture).converter;
      local_4050 = &(pDevice->playback).converter;
      mVar7 = 0;
LAB_00106b0c:
      mVar8 = pDevice->type;
      if (mVar8 == ma_device_type_playback) {
        if ((undefined1  [608])((undefined1  [608])pDevice->field_23 & (undefined1  [608])0x1) !=
            (undefined1  [608])0x0) {
          return -3;
        }
        uVar12 = (pDevice->playback).internalPeriodSizeInFrames;
        iVar5 = (&DAT_001158a0)[(pDevice->playback).internalFormat];
        mVar1 = (pDevice->playback).internalChannels;
        iVar11 = 0;
        if (uVar12 != 0) {
          uVar10 = 0;
          do {
            uVar6 = (uint)(0x1000 / (ulong)(iVar5 * mVar1));
            uVar9 = uVar12 - uVar10;
            if (uVar6 <= uVar12 - uVar10) {
              uVar9 = uVar6;
            }
            ma_device__read_frames_from_client(pDevice,uVar9,local_2038);
            mVar7 = ma_device_write__alsa(pDevice,local_2038,uVar9,local_3038);
            if (mVar7 != 0) goto LAB_00106ec0;
            uVar10 = uVar10 + local_3038[0];
          } while (uVar10 < uVar12);
LAB_00106eb5:
          iVar11 = 0;
          mVar7 = 0;
        }
      }
      else if (mVar8 == ma_device_type_capture) {
        if ((undefined1  [608])((undefined1  [608])pDevice->field_23 & (undefined1  [608])0x2) !=
            (undefined1  [608])0x0) {
          return -3;
        }
        uVar12 = (pDevice->capture).internalPeriodSizeInFrames;
        iVar5 = (&DAT_001158a0)[(pDevice->capture).internalFormat];
        mVar1 = (pDevice->capture).internalChannels;
        iVar11 = 0;
        if (uVar12 != 0) {
          uVar10 = 0;
          do {
            uVar6 = (uint)(0x1000 / (ulong)(iVar5 * mVar1));
            uVar9 = uVar12 - uVar10;
            if (uVar6 <= uVar12 - uVar10) {
              uVar9 = uVar6;
            }
            mVar7 = ma_device_read__alsa(pDevice,local_2038,uVar9,local_3038);
            if (mVar7 != 0) goto LAB_00106ec0;
            ma_device__send_frames_to_client(pDevice,local_3038[0],local_2038);
            uVar10 = uVar10 + local_3038[0];
          } while (uVar10 < uVar12);
          goto LAB_00106eb5;
        }
      }
      else if (mVar8 == ma_device_type_duplex) {
        if ((undefined1  [608])((undefined1  [608])pDevice->field_23 & (undefined1  [608])0x3) !=
            (undefined1  [608])0x0) {
          return -3;
        }
        uVar12 = (pDevice->capture).internalPeriodSizeInFrames;
        uVar10 = (pDevice->playback).internalPeriodSizeInFrames;
        if (uVar12 < uVar10) {
          uVar10 = uVar12;
        }
        iVar11 = 0;
        if (uVar10 != 0) {
          iVar11 = 0;
          uVar12 = 0;
          do {
            mVar1 = (pDevice->playback).internalChannels;
            iVar5 = (&DAT_001158a0)[(pDevice->playback).internalFormat];
            uVar6 = (uint)(0x1000 / (ulong)((&DAT_001158a0)[(pDevice->capture).internalFormat] *
                                           (pDevice->capture).internalChannels));
            uVar9 = uVar10 - uVar12;
            if (uVar6 <= uVar10 - uVar12) {
              uVar9 = uVar6;
            }
            local_4070 = iVar11;
            mVar7 = ma_device_read__alsa(pDevice,local_2038,uVar9,&local_4054);
            if (mVar7 != 0) goto LAB_00106ee7;
            local_4084 = 0;
            uVar3 = 0x1000 / (ulong)(iVar5 * mVar1);
            local_406c = local_4054;
            while( true ) {
              uVar4 = 0x1000 / (ulong)((&DAT_001158a0)[(pDevice->capture).format] *
                                      (pDevice->capture).channels);
              local_4078 = 0x1000 / (ulong)((&DAT_001158a0)[(pDevice->playback).format] *
                                           (pDevice->playback).channels);
              if ((uint)uVar4 < (uint)local_4078) {
                local_4078 = uVar4;
              }
              local_4048 = (ulong)local_406c;
              mVar7 = ma_data_converter_process_pcm_frames
                                (local_4040,
                                 local_2038 +
                                 (pDevice->capture).internalChannels * local_4084 *
                                 (&DAT_001158a0)[(pDevice->capture).internalFormat],&local_4048,
                                 local_1038,&local_4078);
              iVar11 = local_4070;
              if (mVar7 != 0) goto LAB_00106d5c;
              if (local_4078 == 0) {
                mVar7 = 0;
                goto LAB_00106d5c;
              }
              ma_device__on_data(pDevice,local_4038,local_1038,(ma_uint32)local_4078);
              iVar5 = (int)local_4048;
              local_4084 = local_4084 + (int)local_4048;
              local_4060 = local_4078;
              local_4068 = uVar3;
              mVar7 = ma_data_converter_process_pcm_frames
                                (local_4050,local_4038,&local_4060,local_3038,&local_4068);
              if (mVar7 != 0) break;
              local_406c = local_406c - iVar5;
              while( true ) {
                mVar7 = ma_device_write__alsa
                                  (pDevice,local_3038,(ma_uint32)local_4068,(ma_uint32 *)0x0);
                if (mVar7 != 0) goto LAB_00106d57;
                local_4078 = local_4078 - (local_4060 & 0xffffffff);
                if (local_4078 == 0) break;
                local_4068 = uVar3;
                local_4060 = local_4078;
                mVar7 = ma_data_converter_process_pcm_frames
                                  (local_4050,local_4038,&local_4060,local_3038,&local_4068);
                if (mVar7 != 0) goto LAB_00106d57;
              }
            }
LAB_00106d57:
            iVar11 = 1;
LAB_00106d5c:
            uVar12 = uVar12 + local_4084;
          } while (uVar12 < uVar10);
        }
      }
      else {
        iVar11 = 0;
      }
      goto LAB_00106ecd;
    }
LAB_00106ee7:
    mVar8 = pDevice->type;
    if ((mVar8 & ~ma_device_type_playback) == ma_device_type_capture) {
      (*(pDevice->pContext->field_21).alsa.snd_pcm_drain)((pDevice->field_23).alsa.pPCMCapture);
      (*(pDevice->pContext->field_21).alsa.snd_pcm_prepare)((pDevice->field_23).alsa.pPCMCapture);
      mVar8 = pDevice->type;
    }
    if ((mVar8 | ma_device_type_capture) == ma_device_type_duplex) {
      (*(pDevice->pContext->field_21).alsa.snd_pcm_drain)((pDevice->field_23).alsa.pPCMPlayback);
      (*(pDevice->pContext->field_21).alsa.snd_pcm_prepare)((pDevice->field_23).alsa.pPCMPlayback);
    }
  }
  return mVar7;
LAB_00106ec0:
  iVar11 = 1;
LAB_00106ecd:
  if ((pDevice->state != 2) || (iVar11 != 0)) goto LAB_00106ee7;
  goto LAB_00106b0c;
}

Assistant:

static ma_result ma_device_main_loop__alsa(ma_device* pDevice)
{
    ma_result result = MA_SUCCESS;
    int resultALSA;
    ma_bool32 exitLoop = MA_FALSE;

    MA_ASSERT(pDevice != NULL);

    /* Capture devices need to be started immediately. */
    if (pDevice->type == ma_device_type_capture || pDevice->type == ma_device_type_duplex) {
        resultALSA = ((ma_snd_pcm_start_proc)pDevice->pContext->alsa.snd_pcm_start)((ma_snd_pcm_t*)pDevice->alsa.pPCMCapture);
        if (resultALSA < 0) {
            return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[ALSA] Failed to start device in preparation for reading.", ma_result_from_errno(-resultALSA));
        }
    }

    while (ma_device__get_state(pDevice) == MA_STATE_STARTED && !exitLoop) {
        switch (pDevice->type)
        {
            case ma_device_type_duplex:
            {
                if (pDevice->alsa.isUsingMMapCapture || pDevice->alsa.isUsingMMapPlayback) {
                    /* MMAP */
                    return MA_INVALID_OPERATION;    /* Not yet implemented. */
                } else {
                    /* readi() and writei() */

                    /* The process is: device_read -> convert -> callback -> convert -> device_write */
                    ma_uint32 totalCapturedDeviceFramesProcessed = 0;
                    ma_uint32 capturedDevicePeriodSizeInFrames = ma_min(pDevice->capture.internalPeriodSizeInFrames, pDevice->playback.internalPeriodSizeInFrames);
                    
                    while (totalCapturedDeviceFramesProcessed < capturedDevicePeriodSizeInFrames) {
                        ma_uint8  capturedDeviceData[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                        ma_uint8  playbackDeviceData[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                        ma_uint32 capturedDeviceDataCapInFrames = sizeof(capturedDeviceData) / ma_get_bytes_per_frame(pDevice->capture.internalFormat,  pDevice->capture.internalChannels);
                        ma_uint32 playbackDeviceDataCapInFrames = sizeof(playbackDeviceData) / ma_get_bytes_per_frame(pDevice->playback.internalFormat, pDevice->playback.internalChannels);
                        ma_uint32 capturedDeviceFramesRemaining;
                        ma_uint32 capturedDeviceFramesProcessed;
                        ma_uint32 capturedDeviceFramesToProcess;
                        ma_uint32 capturedDeviceFramesToTryProcessing = capturedDevicePeriodSizeInFrames - totalCapturedDeviceFramesProcessed;
                        if (capturedDeviceFramesToTryProcessing > capturedDeviceDataCapInFrames) {
                            capturedDeviceFramesToTryProcessing = capturedDeviceDataCapInFrames;
                        }

                        result = ma_device_read__alsa(pDevice, capturedDeviceData, capturedDeviceFramesToTryProcessing, &capturedDeviceFramesToProcess);
                        if (result != MA_SUCCESS) {
                            exitLoop = MA_TRUE;
                            break;
                        }

                        capturedDeviceFramesRemaining = capturedDeviceFramesToProcess;
                        capturedDeviceFramesProcessed = 0;

                        for (;;) {
                            ma_uint8  capturedClientData[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                            ma_uint8  playbackClientData[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                            ma_uint32 capturedClientDataCapInFrames = sizeof(capturedClientData) / ma_get_bytes_per_frame(pDevice->capture.format, pDevice->capture.channels);
                            ma_uint32 playbackClientDataCapInFrames = sizeof(playbackClientData) / ma_get_bytes_per_frame(pDevice->playback.format, pDevice->playback.channels);
                            ma_uint64 capturedClientFramesToProcessThisIteration = ma_min(capturedClientDataCapInFrames, playbackClientDataCapInFrames);
                            ma_uint64 capturedDeviceFramesToProcessThisIteration = capturedDeviceFramesRemaining;
                            ma_uint8* pRunningCapturedDeviceFrames = ma_offset_ptr(capturedDeviceData, capturedDeviceFramesProcessed * ma_get_bytes_per_frame(pDevice->capture.internalFormat, pDevice->capture.internalChannels));

                            /* Convert capture data from device format to client format. */
                            result = ma_data_converter_process_pcm_frames(&pDevice->capture.converter, pRunningCapturedDeviceFrames, &capturedDeviceFramesToProcessThisIteration, capturedClientData, &capturedClientFramesToProcessThisIteration);
                            if (result != MA_SUCCESS) {
                                break;
                            }

                            /*
                            If we weren't able to generate any output frames it must mean we've exhaused all of our input. The only time this would not be the case is if capturedClientData was too small
                            which should never be the case when it's of the size MA_DATA_CONVERTER_STACK_BUFFER_SIZE.
                            */
                            if (capturedClientFramesToProcessThisIteration == 0) {
                                break;
                            }

                            ma_device__on_data(pDevice, playbackClientData, capturedClientData, (ma_uint32)capturedClientFramesToProcessThisIteration);    /* Safe cast .*/

                            capturedDeviceFramesProcessed += (ma_uint32)capturedDeviceFramesToProcessThisIteration; /* Safe cast. */
                            capturedDeviceFramesRemaining -= (ma_uint32)capturedDeviceFramesToProcessThisIteration; /* Safe cast. */

                            /* At this point the playbackClientData buffer should be holding data that needs to be written to the device. */
                            for (;;) {
                                ma_uint64 convertedClientFrameCount = capturedClientFramesToProcessThisIteration;
                                ma_uint64 convertedDeviceFrameCount = playbackDeviceDataCapInFrames;
                                result = ma_data_converter_process_pcm_frames(&pDevice->playback.converter, playbackClientData, &convertedClientFrameCount, playbackDeviceData, &convertedDeviceFrameCount);
                                if (result != MA_SUCCESS) {
                                    break;
                                }

                                result = ma_device_write__alsa(pDevice, playbackDeviceData, (ma_uint32)convertedDeviceFrameCount, NULL);    /* Safe cast. */
                                if (result != MA_SUCCESS) {
                                    exitLoop = MA_TRUE;
                                    break;
                                }

                                capturedClientFramesToProcessThisIteration -= (ma_uint32)convertedClientFrameCount;  /* Safe cast. */
                                if (capturedClientFramesToProcessThisIteration == 0) {
                                    break;
                                }
                            }

                            /* In case an error happened from ma_device_write__alsa()... */
                            if (result != MA_SUCCESS) {
                                exitLoop = MA_TRUE;
                                break;
                            }
                        }

                        totalCapturedDeviceFramesProcessed += capturedDeviceFramesProcessed;
                    }
                }
            } break;

            case ma_device_type_capture:
            {
                if (pDevice->alsa.isUsingMMapCapture) {
                    /* MMAP */
                    return MA_INVALID_OPERATION;    /* Not yet implemented. */
                } else {
                    /* readi() */

                    /* We read in chunks of the period size, but use a stack allocated buffer for the intermediary. */
                    ma_uint8 intermediaryBuffer[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                    ma_uint32 intermediaryBufferSizeInFrames = sizeof(intermediaryBuffer) / ma_get_bytes_per_frame(pDevice->capture.internalFormat, pDevice->capture.internalChannels);
                    ma_uint32 periodSizeInFrames = pDevice->capture.internalPeriodSizeInFrames;
                    ma_uint32 framesReadThisPeriod = 0;
                    while (framesReadThisPeriod < periodSizeInFrames) {
                        ma_uint32 framesRemainingInPeriod = periodSizeInFrames - framesReadThisPeriod;
                        ma_uint32 framesProcessed;
                        ma_uint32 framesToReadThisIteration = framesRemainingInPeriod;
                        if (framesToReadThisIteration > intermediaryBufferSizeInFrames) {
                            framesToReadThisIteration = intermediaryBufferSizeInFrames;
                        }

                        result = ma_device_read__alsa(pDevice, intermediaryBuffer, framesToReadThisIteration, &framesProcessed);
                        if (result != MA_SUCCESS) {
                            exitLoop = MA_TRUE;
                            break;
                        }

                        ma_device__send_frames_to_client(pDevice, framesProcessed, intermediaryBuffer);

                        framesReadThisPeriod += framesProcessed;
                    }
                }
            } break;

            case ma_device_type_playback:
            {
                if (pDevice->alsa.isUsingMMapPlayback) {
                    /* MMAP */
                    return MA_INVALID_OPERATION;    /* Not yet implemented. */
                } else {
                    /* writei() */

                    /* We write in chunks of the period size, but use a stack allocated buffer for the intermediary. */
                    ma_uint8 intermediaryBuffer[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                    ma_uint32 intermediaryBufferSizeInFrames = sizeof(intermediaryBuffer) / ma_get_bytes_per_frame(pDevice->playback.internalFormat, pDevice->playback.internalChannels);
                    ma_uint32 periodSizeInFrames = pDevice->playback.internalPeriodSizeInFrames;
                    ma_uint32 framesWrittenThisPeriod = 0;
                    while (framesWrittenThisPeriod < periodSizeInFrames) {
                        ma_uint32 framesRemainingInPeriod = periodSizeInFrames - framesWrittenThisPeriod;
                        ma_uint32 framesProcessed;
                        ma_uint32 framesToWriteThisIteration = framesRemainingInPeriod;
                        if (framesToWriteThisIteration > intermediaryBufferSizeInFrames) {
                            framesToWriteThisIteration = intermediaryBufferSizeInFrames;
                        }

                        ma_device__read_frames_from_client(pDevice, framesToWriteThisIteration, intermediaryBuffer);

                        result = ma_device_write__alsa(pDevice, intermediaryBuffer, framesToWriteThisIteration, &framesProcessed);
                        if (result != MA_SUCCESS) {
                            exitLoop = MA_TRUE;
                            break;
                        }

                        framesWrittenThisPeriod += framesProcessed;
                    }
                }
            } break;

            /* To silence a warning. Will never hit this. */
            case ma_device_type_loopback:
            default: break;
        } 
    }

    /* Here is where the device needs to be stopped. */
    if (pDevice->type == ma_device_type_capture || pDevice->type == ma_device_type_duplex) {
        ((ma_snd_pcm_drain_proc)pDevice->pContext->alsa.snd_pcm_drain)((ma_snd_pcm_t*)pDevice->alsa.pPCMCapture);

        /* We need to prepare the device again, otherwise we won't be able to restart the device. */
        if (((ma_snd_pcm_prepare_proc)pDevice->pContext->alsa.snd_pcm_prepare)((ma_snd_pcm_t*)pDevice->alsa.pPCMCapture) < 0) {
    #ifdef MA_DEBUG_OUTPUT
            printf("[ALSA] Failed to prepare capture device after stopping.\n");
    #endif
        }
    }

    if (pDevice->type == ma_device_type_playback || pDevice->type == ma_device_type_duplex) {
        ((ma_snd_pcm_drain_proc)pDevice->pContext->alsa.snd_pcm_drain)((ma_snd_pcm_t*)pDevice->alsa.pPCMPlayback);

        /* We need to prepare the device again, otherwise we won't be able to restart the device. */
        if (((ma_snd_pcm_prepare_proc)pDevice->pContext->alsa.snd_pcm_prepare)((ma_snd_pcm_t*)pDevice->alsa.pPCMPlayback) < 0) {
    #ifdef MA_DEBUG_OUTPUT
            printf("[ALSA] Failed to prepare playback device after stopping.\n");
    #endif
        }
    }

    return result;
}